

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Prepare16(sqlite3 *db,void *zSql,int nBytes,u32 prepFlags,sqlite3_stmt **ppStmt,
                    void **pzTail)

{
  int iVar1;
  int rc;
  long lVar2;
  char *zSql_00;
  u8 enc;
  byte *pbVar3;
  byte *pbVar4;
  char *zTail8;
  char *local_38;
  
  enc = (u8)prepFlags;
  local_38 = (char *)0x0;
  *ppStmt = (sqlite3_stmt *)0x0;
  iVar1 = sqlite3SafetyCheckOk(db);
  if ((zSql == (void *)0x0) || (iVar1 == 0)) {
    iVar1 = 0x15;
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x217e2,
                "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
  }
  else {
    if (-1 < nBytes) {
      if (nBytes == 0) {
        nBytes = 0;
      }
      else {
        lVar2 = 0;
        do {
          if ((*(char *)((long)zSql + lVar2) == '\0') && (*(char *)((long)zSql + lVar2 + 1) == '\0')
             ) break;
          lVar2 = lVar2 + 2;
        } while ((int)lVar2 < nBytes);
        nBytes = (int)lVar2;
      }
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    zSql_00 = sqlite3Utf16to8(db,zSql,nBytes,enc);
    if (zSql_00 == (char *)0x0) {
      rc = 0;
    }
    else {
      rc = sqlite3LockAndPrepare(db,zSql_00,-1,prepFlags,(Vdbe *)0x0,ppStmt,&local_38);
    }
    if (pzTail != (void **)0x0 && local_38 != (char *)0x0) {
      iVar1 = sqlite3Utf8CharLen(zSql_00,(int)local_38 - (int)zSql_00);
      pbVar4 = (byte *)((long)zSql + 1);
      pbVar3 = pbVar4;
      if (0 < iVar1) {
        do {
          pbVar4 = pbVar3 + 2;
          if (((*pbVar3 & 0xfc) == 0xd8) && ((pbVar3[2] & 0xfc) == 0xdc)) {
            pbVar4 = pbVar3 + 4;
          }
          iVar1 = iVar1 + -1;
          pbVar3 = pbVar4;
        } while (iVar1 != 0);
      }
      *pzTail = (void *)((long)(int)((int)pbVar4 + ~(uint)zSql) + (long)zSql);
    }
    if (zSql_00 != (char *)0x0) {
      sqlite3DbFreeNN(db,zSql_00);
    }
    if ((rc != 0) || (iVar1 = 0, db->mallocFailed != '\0')) {
      iVar1 = apiHandleError(db,rc);
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  return iVar1;
}

Assistant:

static int sqlite3Prepare16(
  sqlite3 *db,              /* Database handle. */
  const void *zSql,         /* UTF-16 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  u32 prepFlags,            /* Zero or more SQLITE_PREPARE_* flags */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const void **pzTail       /* OUT: End of parsed string */
){
  /* This function currently works by first transforming the UTF-16
  ** encoded string to UTF-8, then invoking sqlite3_prepare(). The
  ** tricky bit is figuring out the pointer to return in *pzTail.
  */
  char *zSql8;
  const char *zTail8 = 0;
  int rc = SQLITE_OK;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppStmt==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *ppStmt = 0;
  if( !sqlite3SafetyCheckOk(db)||zSql==0 ){
    return SQLITE_MISUSE_BKPT;
  }
  if( nBytes>=0 ){
    int sz;
    const char *z = (const char*)zSql;
    for(sz=0; sz<nBytes && (z[sz]!=0 || z[sz+1]!=0); sz += 2){}
    nBytes = sz;
  }
  sqlite3_mutex_enter(db->mutex);
  zSql8 = sqlite3Utf16to8(db, zSql, nBytes, SQLITE_UTF16NATIVE);
  if( zSql8 ){
    rc = sqlite3LockAndPrepare(db, zSql8, -1, prepFlags, 0, ppStmt, &zTail8);
  }

  if( zTail8 && pzTail ){
    /* If sqlite3_prepare returns a tail pointer, we calculate the
    ** equivalent pointer into the UTF-16 string by counting the unicode
    ** characters between zSql8 and zTail8, and then returning a pointer
    ** the same number of characters into the UTF-16 string.
    */
    int chars_parsed = sqlite3Utf8CharLen(zSql8, (int)(zTail8-zSql8));
    *pzTail = (u8 *)zSql + sqlite3Utf16ByteLen(zSql, chars_parsed);
  }
  sqlite3DbFree(db, zSql8);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}